

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

int32_t ucurr_getNumericCode_63(UChar *currency)

{
  char *cs;
  int32_t iVar1;
  undefined8 in_RAX;
  UResourceBundle *resB;
  int32_t iVar2;
  UErrorCode status;
  char alphaCode [4];
  undefined8 local_28;
  
  local_28._4_4_ = (uint)((ulong)in_RAX >> 0x20);
  iVar2 = 0;
  if (currency != (UChar *)0x0) {
    iVar1 = u_strlen_63(currency);
    iVar2 = 0;
    if (iVar1 == 3) {
      local_28 = (ulong)local_28._4_4_ << 0x20;
      resB = ures_openDirect_63((char *)0x0,"currencyNumericCodes",(UErrorCode *)&local_28);
      ures_getByKey_63(resB,"codeMap",resB,(UErrorCode *)&local_28);
      iVar2 = 0;
      if ((UErrorCode)local_28 < U_ILLEGAL_ARGUMENT_ERROR) {
        cs = (char *)((long)&local_28 + 4);
        u_UCharsToChars_63(currency,cs,3);
        local_28 = local_28 & 0xffffffffffffff;
        T_CString_toUpperCase_63(cs);
        ures_getByKey_63(resB,cs,resB,(UErrorCode *)&local_28);
        iVar1 = ures_getInt_63(resB,(UErrorCode *)&local_28);
        iVar2 = 0;
        if ((UErrorCode)local_28 < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar2 = iVar1;
        }
      }
      ures_close_63(resB);
    }
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucurr_getNumericCode(const UChar* currency) {
    int32_t code = 0;
    if (currency && u_strlen(currency) == ISO_CURRENCY_CODE_LENGTH) {
        UErrorCode status = U_ZERO_ERROR;

        UResourceBundle *bundle = ures_openDirect(0, "currencyNumericCodes", &status);
        ures_getByKey(bundle, "codeMap", bundle, &status);
        if (U_SUCCESS(status)) {
            char alphaCode[ISO_CURRENCY_CODE_LENGTH+1];
            myUCharsToChars(alphaCode, currency);
            T_CString_toUpperCase(alphaCode);
            ures_getByKey(bundle, alphaCode, bundle, &status);
            int tmpCode = ures_getInt(bundle, &status);
            if (U_SUCCESS(status)) {
                code = tmpCode;
            }
        }
        ures_close(bundle);
    }
    return code;
}